

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vec4f * __thiscall
Shader::vertex(vec4f *__return_storage_ptr__,Shader *this,Model *model,int iface,int nthvert)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  size_t i;
  size_t nthvert_00;
  bool bVar6;
  undefined4 uVar7;
  double ret_1;
  undefined4 uVar8;
  vec2f vVar9;
  vec<4UL,_double> ret;
  vec<4UL,_double> ret_2;
  vec<3UL,_double> ret_3;
  double local_178 [4];
  mat<4UL,_4UL> local_158;
  vec3f local_d0;
  mat<4UL,_4UL> local_b8;
  
  nthvert_00 = (size_t)nthvert;
  vVar9 = Model::uv(model,(long)iface,nthvert_00);
  local_158.rows[0].data[1] = vVar9.y;
  local_158.rows[0].data[0] = vVar9.x;
  mat<2UL,_3UL>::set_col(&this->varying_uv,nthvert_00,(vec<2UL,_double> *)&local_158);
  operator*(&local_b8,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*(&local_158,&local_b8,&(this->super_IShader).uniform_ModelView);
  Model::vert(&local_d0,model,(long)iface,nthvert_00);
  local_178[2] = 0.0;
  local_178[3] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  i = 3;
  do {
    uVar7 = 0;
    uVar8 = 0x3ff00000;
    if (i + 1 < 4) {
      dVar1 = vec<3UL,_double>::operator[](&local_d0,i);
      uVar7 = SUB84(dVar1,0);
      uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_178[i] = (double)CONCAT44(uVar8,uVar7);
    bVar6 = i != 0;
    i = i - 1;
  } while (bVar6);
  __return_storage_ptr__->data[2] = 0.0;
  __return_storage_ptr__->data[3] = 0.0;
  __return_storage_ptr__->data[0] = 0.0;
  __return_storage_ptr__->data[1] = 0.0;
  pdVar4 = local_158.rows[3].data + 3;
  lVar3 = 4;
  do {
    lVar2 = lVar3 + -1;
    dVar1 = 0.0;
    lVar5 = 0;
    do {
      dVar1 = dVar1 + pdVar4[lVar5] * local_158.rows[0].data[lVar5 + -1];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    __return_storage_ptr__->data[lVar3 + -1] = dVar1;
    pdVar4 = pdVar4 + -4;
    lVar3 = lVar2;
  } while (lVar2 != 0);
  local_158.rows[0].data[2] = __return_storage_ptr__->data[2];
  local_158.rows[0].data[3] = __return_storage_ptr__->data[3];
  local_158.rows[0].data[0] = __return_storage_ptr__->data[0];
  local_158.rows[0].data[1] = __return_storage_ptr__->data[1];
  dVar1 = __return_storage_ptr__->data[3];
  lVar3 = 3;
  do {
    local_158.rows[0].data[lVar3] = local_158.rows[0].data[lVar3] / dVar1;
    bVar6 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar6);
  local_b8.rows[0].data[0] = 0.0;
  local_b8.rows[0].data[1] = 0.0;
  local_b8.rows[0].data[2] = 0.0;
  lVar3 = 3;
  do {
    lVar2 = (ulong)(lVar3 != 2) * 8 + 8;
    if (lVar3 == 1) {
      lVar2 = 0;
    }
    *(double *)((long)local_b8.rows[0].data + lVar2) = local_158.rows[0].data[lVar3 + -1];
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  mat<3UL,_3UL>::set_col(&this->varying_tri,nthvert_00,(vec<3UL,_double> *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        varying_uv.set_col(nthvert, model.uv(iface, nthvert));
        vec4f gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                          embed<4>(model.vert(iface, nthvert));
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }